

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generator.cpp
# Opt level: O2

void __thiscall Code_generator::visit(Code_generator *this,Inst_rrx *s)

{
  Register *pRVar1;
  uint uVar2;
  allocator local_39;
  string local_38;
  
  ast::Instruction::check_alignment(&s->super_Instruction);
  pRVar1 = s->rn;
  uVar2 = pRVar1->n;
  if (7 < uVar2) {
    std::__cxx11::string::string((string *)&local_38,"Invalid register",&local_39);
    error_report(&pRVar1->location,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    uVar2 = s->rn->n;
  }
  ast::Sections::write16
            ((s->super_Instruction).super_Statement.section_index,
             (s->super_Instruction).super_Statement.section_offset,
             (short)uVar2 * 0x10 + (short)s->rd->n + 0xd800);
  return;
}

Assistant:

void Code_generator::visit(Inst_rrx *s)
{
	s->check_alignment();
	if (s->rn->n > 7)
		error_report(&s->rn->location, "Invalid register");
	Sections::write16(s->section_index, s->section_offset,
			  static_cast<uint16_t>(RRX_OPCODE + (s->rn->n << RN_POSITION) + (s->rd->n << RD_POSITION)));
}